

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::DeepScanLineInputFile::initialize(DeepScanLineInputFile *this,Header *header)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t __n;
  uint *puVar5;
  bool *pbVar6;
  char *pcVar7;
  int iVar8;
  Format FVar9;
  string *psVar10;
  int *piVar11;
  LineOrder *pLVar12;
  Box2i *pBVar13;
  uint *puVar14;
  Compression *pCVar15;
  Compressor *pCVar16;
  LineBuffer *pLVar17;
  bool *pbVar18;
  char *pcVar19;
  ChannelList *this_00;
  const_iterator cVar20;
  ConstIterator CVar21;
  ostream *poVar22;
  ArgExc *pAVar23;
  long lVar24;
  Data *pDVar25;
  ulong uVar26;
  ConstIterator tmp;
  long lVar27;
  stringstream _iex_throw_s;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  psVar10 = Header::type_abi_cxx11_(header);
  __n = psVar10->_M_string_length;
  if (__n == _DAT_003db728) {
    if (__n != 0) {
      iVar8 = bcmp((psVar10->_M_dataplus)._M_p,DEEPSCANLINE_abi_cxx11_,__n);
      if (iVar8 != 0) goto LAB_001606b5;
    }
    if (this->_data->partNumber != -1) {
LAB_00160248:
      piVar11 = Header::version(header);
      if (*piVar11 != 1) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Version ",8);
        piVar11 = Header::version(header);
        poVar22 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,*piVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22," not supported for deepscanline images in this version of the library",
                   0x45);
        pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar23,local_1b8);
        __cxa_throw(pAVar23,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      Header::operator=(&this->_data->header,header);
      pLVar12 = Header::lineOrder(&this->_data->header);
      pDVar25 = this->_data;
      pDVar25->lineOrder = *pLVar12;
      pBVar13 = Header::dataWindow(&pDVar25->header);
      iVar8 = (pBVar13->min).x;
      pDVar25 = this->_data;
      pDVar25->minX = iVar8;
      iVar2 = (pBVar13->max).x;
      pDVar25->maxX = iVar2;
      iVar3 = (pBVar13->min).y;
      pDVar25->minY = iVar3;
      iVar4 = (pBVar13->max).y;
      pDVar25->maxY = iVar4;
      lVar24 = (long)((iVar2 - iVar8) + 1);
      lVar27 = (long)((iVar4 - iVar3) + 1);
      uVar26 = lVar27 * lVar24;
      if (uVar26 < 0x10000001) {
        puVar14 = (uint *)operator_new__(uVar26 * 4);
        puVar5 = (pDVar25->sampleCount)._data;
        if (puVar5 != (uint *)0x0) {
          operator_delete__(puVar5);
        }
        (pDVar25->sampleCount)._sizeX = lVar27;
        (pDVar25->sampleCount)._sizeY = lVar24;
        (pDVar25->sampleCount)._data = puVar14;
      }
      else {
        pDVar25->bigFile = true;
      }
      pDVar25 = this->_data;
      lVar24 = (long)pDVar25->maxY - (long)pDVar25->minY;
      uVar26 = 0xffffffffffffffff;
      if (-2 < (int)lVar24) {
        uVar26 = lVar24 * 4 + 4;
      }
      puVar14 = (uint *)operator_new__(uVar26);
      puVar5 = (pDVar25->lineSampleCount)._data;
      if (puVar5 != (uint *)0x0) {
        operator_delete__(puVar5);
      }
      (pDVar25->lineSampleCount)._size = lVar24 + 1;
      (pDVar25->lineSampleCount)._data = puVar14;
      pCVar15 = Header::compression(&this->_data->header);
      pCVar16 = newCompressor(*pCVar15,0,&this->_data->header);
      iVar8 = numLinesInBuffer(pCVar16);
      this->_data->linesInBuffer = iVar8;
      if (pCVar16 != (Compressor *)0x0) {
        (*pCVar16->_vptr_Compressor[1])(pCVar16);
      }
      pDVar25 = this->_data;
      pDVar25->nextLineBufferMinY = pDVar25->minY + -1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&pDVar25->lineOffsets,
                 (long)((((pBVar13->max).y - (pBVar13->min).y) + pDVar25->linesInBuffer) /
                       pDVar25->linesInBuffer));
      pDVar25 = this->_data;
      if ((pDVar25->lineBuffers).
          super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pDVar25->lineBuffers).
          super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar26 = 0;
        do {
          pLVar17 = (LineBuffer *)operator_new(0xa0);
          pLVar17->compressor = (Compressor *)0x0;
          pLVar17->uncompressedData = (char *)0x0;
          pLVar17->buffer = (char *)0x0;
          pLVar17->packedDataSize = 0;
          FVar9 = defaultFormat((Compressor *)0x0);
          pLVar17->format = FVar9;
          pLVar17->number = -1;
          pLVar17->hasException = false;
          (pLVar17->exception)._M_dataplus._M_p = (pointer)&(pLVar17->exception).field_2;
          (pLVar17->exception)._M_string_length = 0;
          (pLVar17->exception).field_2._M_local_buf[0] = '\0';
          (pLVar17->_tempCountBuffer)._sizeX = 0;
          (pLVar17->_tempCountBuffer)._sizeY = 0;
          (pLVar17->_tempCountBuffer)._data = (uint *)0x0;
          IlmThread_3_2::Semaphore::Semaphore(&pLVar17->_sem,1);
          (this->_data->lineBuffers).
          super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar26] = pLVar17;
          uVar26 = uVar26 + 1;
          pDVar25 = this->_data;
        } while (uVar26 < (ulong)((long)(pDVar25->lineBuffers).
                                        super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pDVar25->lineBuffers).
                                        super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      uVar26 = (ulong)((pDVar25->maxY - pDVar25->minY) + 1);
      pbVar18 = (bool *)operator_new__(uVar26);
      pbVar6 = (pDVar25->gotSampleCount)._data;
      if (pbVar6 != (bool *)0x0) {
        operator_delete__(pbVar6);
      }
      (pDVar25->gotSampleCount)._size = uVar26;
      (pDVar25->gotSampleCount)._data = pbVar18;
      pDVar25 = this->_data;
      iVar8 = pDVar25->maxY;
      iVar2 = pDVar25->minY;
      if (iVar2 <= iVar8) {
        memset((pDVar25->gotSampleCount)._data,0,(ulong)((iVar8 - iVar2) + 1));
      }
      lVar27 = ((long)iVar8 - (long)iVar2) + 1;
      lVar24 = (long)pDVar25->linesInBuffer;
      if (lVar27 < pDVar25->linesInBuffer) {
        lVar24 = lVar27;
      }
      lVar24 = lVar24 * (((long)pDVar25->maxX - (long)pDVar25->minX) + 1);
      lVar27 = lVar24 * 4;
      if (lVar27 < 0x80000000) {
        pDVar25->maxSampleCountTableSize = (int)lVar27;
        uVar26 = (lVar24 << 0x22) >> 0x20;
        pcVar19 = (char *)operator_new__(uVar26);
        pcVar7 = (pDVar25->sampleCountTableBuffer)._data;
        if (pcVar7 != (char *)0x0) {
          operator_delete__(pcVar7);
        }
        (pDVar25->sampleCountTableBuffer)._size = uVar26;
        (pDVar25->sampleCountTableBuffer)._data = pcVar19;
        pCVar15 = Header::compression(&this->_data->header);
        pCVar16 = newCompressor(*pCVar15,(long)this->_data->maxSampleCountTableSize,
                                &this->_data->header);
        pDVar25 = this->_data;
        pDVar25->sampleCountTableComp = pCVar16;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (&pDVar25->bytesPerLine,(long)((pDVar25->maxY - pDVar25->minY) + 1));
        this_00 = Header::channels(header);
        this->_data->combinedSampleSize = 0;
        cVar20._M_node = (_Base_ptr)ChannelList::begin(this_00);
        while( true ) {
          CVar21 = ChannelList::end(this_00);
          if ((const_iterator)cVar20._M_node == CVar21._i._M_node) {
            return;
          }
          if (2 < (ulong)cVar20._M_node[9]._M_color) break;
          piVar11 = &this->_data->combinedSampleSize;
          *piVar11 = *piVar11 + *(int *)(&DAT_002052cc + (ulong)cVar20._M_node[9]._M_color * 4);
          cVar20._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar20._M_node);
        }
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Bad type for channel ",0x15);
        poVar22 = std::operator<<(local_1a8,(char *)(cVar20._M_node + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22," initializing deepscanline reader",0x21);
        pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar23,local_1b8);
        __cxa_throw(pAVar23,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Deep scanline image size ",0x19)
      ;
      poVar22 = std::ostream::_M_insert<long>((long)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22," x ",3);
      poVar22 = std::ostream::_M_insert<long>((long)poVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22," exceeds maximum size",0x15);
      pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar23,local_1b8);
      __cxa_throw(pAVar23,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    uVar1 = this->_data->version;
    if ((uVar1 >> 9 & 1) == 0) {
      if ((uVar1 >> 0xb & 1) != 0) goto LAB_00160248;
      pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc
                (pAVar23,"Expected a deep scanline file but the file is not a deep image.");
    }
    else {
      pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar23,"Expected a deep scanline file but the file is tiled.");
    }
  }
  else {
LAB_001606b5:
    pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc
              (pAVar23,"Can\'t build a DeepScanLineInputFile from a type-mismatched part.");
  }
  __cxa_throw(pAVar23,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineInputFile::initialize (const Header& header)
{
    try
    {
        if (header.type () != DEEPSCANLINE)
            throw IEX_NAMESPACE::ArgExc (
                "Can't build a DeepScanLineInputFile from "
                "a type-mismatched part.");

        if (_data->partNumber == -1)
        {
            if (isTiled (_data->version))
                throw IEX_NAMESPACE::ArgExc (
                    "Expected a deep scanline file but the file is tiled.");

            if (!isNonImage (_data->version))
                throw IEX_NAMESPACE::ArgExc (
                    "Expected a deep scanline file but the file is not a deep image.");
        }

        if (header.version () != 1)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Version "
                    << header.version ()
                    << " not supported for deepscanline images in this version of the library");
        }

        _data->header = header;

        _data->lineOrder = _data->header.lineOrder ();

        const Box2i& dataWindow = _data->header.dataWindow ();

        _data->minX = dataWindow.min.x;
        _data->maxX = dataWindow.max.x;
        _data->minY = dataWindow.min.y;
        _data->maxY = dataWindow.max.y;

        if (static_cast<uint64_t> (_data->maxX - _data->minX + 1) *
                static_cast<uint64_t> (_data->maxY - _data->minY + 1) >
            gBigFileDataWindowSize)
        {
            _data->bigFile = true;
        }
        else
        {
            _data->sampleCount.resizeErase (
                _data->maxY - _data->minY + 1, _data->maxX - _data->minX + 1);
        }
        _data->lineSampleCount.resizeErase (_data->maxY - _data->minY + 1);

        Compressor* compressor =
            newCompressor (_data->header.compression (), 0, _data->header);

        _data->linesInBuffer = numLinesInBuffer (compressor);

        delete compressor;

        _data->nextLineBufferMinY = _data->minY - 1;

        int lineOffsetSize =
            (dataWindow.max.y - dataWindow.min.y + _data->linesInBuffer) /
            _data->linesInBuffer;

        _data->lineOffsets.resize (lineOffsetSize);

        for (size_t i = 0; i < _data->lineBuffers.size (); i++)
            _data->lineBuffers[i] = new LineBuffer ();

        _data->gotSampleCount.resizeErase (_data->maxY - _data->minY + 1);
        for (int i = 0; i < _data->maxY - _data->minY + 1; i++)
            _data->gotSampleCount[i] = false;

        int64_t imageHeight = static_cast<int64_t>(_data->maxY) - static_cast<int64_t>(_data->minY) + 1;
        int64_t imageWidth = static_cast<int64_t>(_data->maxX) - static_cast<int64_t>(_data->minX) +1;

        int64_t tableSize =  min (static_cast<int64_t>(_data->linesInBuffer), imageHeight) * imageWidth
            * sizeof (unsigned int);

        if (tableSize>std::numeric_limits<int>::max() )
        {
             THROW (IEX_NAMESPACE::ArgExc,
                    "Deep scanline image size "
                    << imageWidth << " x " <<  imageHeight
                    << " exceeds maximum size");
        }
        _data->maxSampleCountTableSize =tableSize;



        _data->sampleCountTableBuffer.resizeErase (
            _data->maxSampleCountTableSize);

        _data->sampleCountTableComp = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);

        _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);

        const ChannelList& c = header.channels ();

        _data->combinedSampleSize = 0;
        for (ChannelList::ConstIterator i = c.begin (); i != c.end (); i++)
        {
            switch (i.channel ().type)
            {
                case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:
                    _data->combinedSampleSize += Xdr::size<half> ();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:
                    _data->combinedSampleSize += Xdr::size<float> ();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
                    _data->combinedSampleSize += Xdr::size<unsigned int> ();
                    break;
                default:
                    THROW (
                        IEX_NAMESPACE::ArgExc,
                        "Bad type for channel "
                            << i.name ()
                            << " initializing deepscanline reader");
            }
        }
    }
    catch (...)
    {
        // Don't delete _data here, leave that to caller
        throw;
    }
}